

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gedung.h
# Opt level: O2

void __thiscall Jalan::Jalan(Jalan *this)

{
  blok *pbVar1;
  bengkok *pbVar2;
  
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x1cc,400,-0x1e0,10,1,-1,0x2d);
  this->jalanparkirankekiri = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x1ae,400,0,10,1,-1,0x11);
  this->jalanparkirankekanan = pbVar1;
  pbVar2 = (bengkok *)operator_new(0x38);
  bengkok::bengkok(pbVar2,400,400,-0x1ae,10,1,-5,6);
  this->jalanujungkiri = pbVar2;
  pbVar2 = (bengkok *)operator_new(0x38);
  bengkok::bengkok(pbVar2,0x3b6,400,-0x1ae,10,1,-5,-5);
  this->jalanujungkiribelakang = pbVar2;
  pbVar2 = (bengkok *)operator_new(0x38);
  bengkok::bengkok(pbVar2,400,400,-0x1e,10,1,3,3);
  this->jalanujungkanan = pbVar2;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,400,400,-0x1e,10,1,-0x28,1);
  this->jalanparkiran = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x3b6,400,-0x32,10,1,-0x26,1);
  this->jalanparkiranbelakang = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,600,400,0,10,1,-0x30,1);
  this->jalanseblabtek = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,400,400,-200,10,1,-2,0x14);
  this->jalanboulevard = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x1fe,400,-0xdc,10,1,-10,1);
  this->jalanboulevard1 = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x1fe,400,-0x136,10,1,-1,10);
  this->jalanboulevard2 = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x1fe,400,-0xd2,10,1,10,1);
  this->jalanboulevard3 = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x1fe,400,-0x6e,10,1,-1,10);
  this->jalanboulevard4 = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,400,400,-0x1a4,10,1,-1,0x19);
  this->jalankirigku = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,600,400,-0xc3,10,1,-3,0xc);
  this->jalanintel = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,600,400,-0x154,10,1,-1,10);
  this->jalangkutokema = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,700,400,-0x168,10,1,-1,0x10);
  this->jalanmesinmatik = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x2da,400,-0xc3,10,1,-3,0xc);
  this->jalantaman = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x35c,400,-0xbe,10,1,-4,9);
  this->jalansunken = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,700,400,-0x154,10,1,-0xe,1);
  this->jalangkumesin = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x2d0,400,-0x32,10,1,-0x20,1);
  this->jalansetlabtek = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x352,400,-0x32,10,1,-0x20,1);
  this->jalansebperpus = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,600,400,-0x32,10,1,-1,0x28);
  this->gangkanan = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x302,400,0x46,10,1,-0xd,1);
  this->jalansebgang1 = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x334,400,0x46,10,1,-0xd,1);
  this->jalansebgang2 = pbVar1;
  pbVar1 = (blok *)operator_new(0x38);
  blok::blok(pbVar1,0x38e,400,0x46,10,1,-0xd,2);
  this->jalansebgang3 = pbVar1;
  return;
}

Assistant:

Jalan(){
    jalanparkirankekiri = new blok(300+160,400,-480,10,1,-1,45);
    jalanparkirankekanan = new blok(300+130,400,0,10,1,-1,17);
    jalanujungkiri = new bengkok(300+100,400,-430,10,1,-5,6);
    jalanujungkiribelakang = new bengkok(300+650,400,-430,10,1,-5,-5);
    jalanujungkanan = new bengkok(300+100,400,-30,10,1,3,3);
    jalanparkiran = new blok(300+100,400,-30,10,1,-40,1);
    jalanparkiranbelakang = new blok(300+650,400,-50,10,1,-38,1);
    jalanseblabtek = new blok(300+300,400,0,10,1,-48,1); 
    jalanboulevard = new blok(300+100,400,-200,10,1,-2,20);
    jalanboulevard1 = new blok(300+210,400,-220,10,1,-10,1);
    jalanboulevard2 = new blok(300+210,400,-310,10,1,-1,10);
    jalanboulevard3 = new blok(300+210,400,-210,10,1,10,1);
    jalanboulevard4 = new blok(300+210,400,-110,10,1,-1,10);
    jalankirigku = new blok(300+100,400,-420,10,1,-1,25);
    jalanintel = new blok(300+300,400,-195,10,1,-3,12);
    jalangkutokema = new blok(300+300,400,-340,10,1,-1,10);
    jalanmesinmatik = new blok(300+400,400,-360,10,1,-1,16);
    jalantaman = new blok(300+430,400,-195,10,1,-3,12);
    jalansunken = new blok(300+560,400,-190,10,1,-4,9);
    jalangkumesin = new blok(300+400,400,-340,10,1,-14,1);
    jalansetlabtek = new blok(300+420,400,-50,10,1,-32,1);
    jalansebperpus = new blok(300+550,400,-50,10,1,-32,1);
    gangkanan = new blok(300+300,400,-50,10,1,-1,40);
    jalansebgang1 = new blok(300+470,400,70,10,1,-13,1);
    //jalansebgang1->rotate(0,Point<double>(475,400,5),0,15);
    jalansebgang2 = new blok(300+520,400,70,10,1,-13,1);
    //jalansebgang2->rotate(0,Point<double>(525,400,5),0,15);
    jalansebgang3 = new blok(300+610,400,70,10,1,-13,2);
    //jalansebgang3->rotate(0,Point<double>(610,400,5),0,15);
  }